

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void vdbeReleaseAndSetInt64(Mem *pMem,i64 val)

{
  undefined8 in_RSI;
  undefined8 *in_RDI;
  
  sqlite3VdbeMemSetNull((Mem *)0x174b38);
  *in_RDI = in_RSI;
  *(undefined2 *)((long)in_RDI + 0x14) = 4;
  return;
}

Assistant:

static SQLITE_NOINLINE void vdbeReleaseAndSetInt64(Mem *pMem, i64 val){
  sqlite3VdbeMemSetNull(pMem);
  pMem->u.i = val;
  pMem->flags = MEM_Int;
}